

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::LexException::LexException<char_const(&)[19]>
          (LexException *this,char *module,int line,int column,char (*args) [19])

{
  int *in_stack_00000170;
  char *in_stack_00000178;
  int *in_stack_00000180;
  char *in_stack_00000188;
  char **in_stack_00000190;
  Exception *in_stack_00000198;
  char *in_stack_000001b0;
  char (*in_stack_000001b8) [19];
  
  Exception::Exception((Exception *)0x1be20a);
  Exception::SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[19]>
            (in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000180,
             in_stack_00000178,in_stack_00000170,in_stack_000001b0,in_stack_000001b8);
  return;
}

Assistant:

LexException(const char *module, int line, int column, Args&&... args)
        {
            SetWhat(module, ':', line, ':', column, ' ',
                    std::forward<Args>(args)...);
        }